

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O2

void __thiscall Liby::Connection::handleWritEvent(Connection *this)

{
  _Elt_pointer piVar1;
  element_type *peVar2;
  function<void_()> *this_00;
  Buffer *this_01;
  _Head_base<0UL,_std::function<void_()>_*,_false> this_02;
  ulong uVar3;
  off_t oVar4;
  int *piVar5;
  off_t *in_RCX;
  bool bVar6;
  ulong len;
  size_t in_R8;
  _Map_pointer ppiVar7;
  io_task *x_1;
  _Elt_pointer piVar8;
  _Elt_pointer piVar9;
  deque<Liby::io_task,_std::allocator<Liby::io_task>_> *__range3;
  off_t offset;
  undefined8 uStack_90;
  pointer local_88;
  undefined8 uStack_80;
  iovec v;
  ConnPtr x;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  std::__shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&x.super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>,
             &(this->self_).super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>);
  uStack_90 = 0;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Connection.cpp:169:17)>
             ::_M_invoke;
  local_58._8_8_ = 0;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Connection.cpp:169:17)>
             ::_M_manager;
  local_88 = (pointer)0x0;
  uStack_80 = 0;
  offset = (off_t)this;
  local_58._M_unused._M_object = this;
  DeferCaller::~DeferCaller((DeferCaller *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&offset);
  do {
    piVar8 = (this->writTasks_).super__Deque_base<Liby::io_task,_std::allocator<Liby::io_task>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
    piVar1 = (this->writTasks_).super__Deque_base<Liby::io_task,_std::allocator<Liby::io_task>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (piVar1 == piVar8) break;
    peVar2 = (piVar8->fp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar2 == (element_type *)0x0) {
      local_88 = (pointer)0x0;
      offset = 0;
      uStack_90 = 0;
      piVar9 = (this->writTasks_).super__Deque_base<Liby::io_task,_std::allocator<Liby::io_task>_>.
               _M_impl.super__Deque_impl_data._M_start._M_last;
      ppiVar7 = (this->writTasks_).super__Deque_base<Liby::io_task,_std::allocator<Liby::io_task>_>.
                _M_impl.super__Deque_impl_data._M_start._M_node;
      while (((piVar8 != piVar1 &&
              ((piVar8->fp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr == (element_type *)0x0)) &&
             (this_01 = (piVar8->buffer_).
                        super___shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             this_01 != (Buffer *)0x0))) {
        v.iov_base = Buffer::data(this_01);
        v.iov_len = Buffer::size((piVar8->buffer_).
                                 super___shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                                );
        std::vector<iovec,_std::allocator<iovec>_>::push_back
                  ((vector<iovec,_std::allocator<iovec>_> *)&offset,&v);
        piVar8 = piVar8 + 1;
        if (piVar8 == piVar9) {
          piVar8 = ppiVar7[1];
          ppiVar7 = ppiVar7 + 1;
          piVar9 = piVar8 + 9;
        }
      }
      uVar3 = Socket::writev((this->socket_).
                             super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                             (int)offset,(iovec *)((ulong)(uStack_90 - offset) >> 4),(int)in_RCX);
      len = uVar3 & 0xffffffff;
      if ((int)uVar3 < 1) {
        if ((int)uVar3 != 0) {
          piVar5 = __errno_location();
          bVar6 = true;
          if (*piVar5 == 0xb) goto LAB_0011141c;
        }
        handleErroEvent(this);
        bVar6 = true;
      }
      else {
        for (; 0 < (int)len; len = (ulong)(uint)((int)len - (int)oVar4)) {
          oVar4 = Buffer::size((((this->writTasks_).
                                 super__Deque_base<Liby::io_task,_std::allocator<Liby::io_task>_>.
                                 _M_impl.super__Deque_impl_data._M_start._M_cur)->buffer_).
                               super___shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          if ((long)len < oVar4) {
            Buffer::retrieve((((this->writTasks_).
                               super__Deque_base<Liby::io_task,_std::allocator<Liby::io_task>_>.
                               _M_impl.super__Deque_impl_data._M_start._M_cur)->buffer_).
                             super___shared_ptr<Liby::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,len
                            );
            bVar6 = true;
            goto LAB_0011141c;
          }
          this_02._M_head_impl =
               (((this->writTasks_).super__Deque_base<Liby::io_task,_std::allocator<Liby::io_task>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur)->handler_)._M_t.
               super___uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>
               .super__Head_base<0UL,_std::function<void_()>_*,_false>._M_head_impl;
          if ((this_02._M_head_impl != (function<void_()> *)0x0) &&
             (std::function<void_()>::operator()(this_02._M_head_impl), this->destroy_ != false)) {
            bVar6 = true;
            goto LAB_0011141c;
          }
          std::deque<Liby::io_task,_std::allocator<Liby::io_task>_>::pop_front(&this->writTasks_);
        }
        bVar6 = false;
      }
LAB_0011141c:
      std::_Vector_base<iovec,_std::allocator<iovec>_>::~_Vector_base
                ((_Vector_base<iovec,_std::allocator<iovec>_> *)&offset);
    }
    else {
      offset = piVar8->offset_;
      in_RCX = (off_t *)piVar8->len_;
      uVar3 = Socket::sendfile((this->socket_).
                               super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                               peVar2->fd_,(int)&offset,in_RCX,in_R8);
      if ((int)uVar3 < 1) {
        if ((int)uVar3 != 0) {
          piVar5 = __errno_location();
          bVar6 = true;
          if (*piVar5 == 0xb) goto LAB_00111424;
        }
        handleErroEvent(this);
        bVar6 = true;
      }
      else {
        in_RCX = (off_t *)(piVar8->len_ - (uVar3 & 0xffffffff));
        if (in_RCX == (off_t *)0x0) {
          this_00 = (piVar8->handler_)._M_t.
                    super___uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>
                    .super__Head_base<0UL,_std::function<void_()>_*,_false>._M_head_impl;
          if (this_00 != (function<void_()> *)0x0) {
            std::function<void_()>::operator()(this_00);
          }
          std::deque<Liby::io_task,_std::allocator<Liby::io_task>_>::pop_front(&this->writTasks_);
          bVar6 = false;
        }
        else {
          piVar8->len_ = (off_t)in_RCX;
          piVar8->offset_ = piVar8->offset_ + (uVar3 & 0xffffffff);
          bVar6 = true;
        }
      }
    }
LAB_00111424:
  } while (!bVar6);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&x.super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void Connection::handleWritEvent() {
    //    if (writTasks_.empty()) {
    //
    //        return;
    //    }

    auto x = self_;
    DeferCaller([this] {
        if (destroy_)
            return;
        if (writTasks_.empty())
            enableWrit(false);
    });
    //    enableWrit(false);

    //    ssize_t bytes = 0; // 注: sendfile的字节数不计入bytes中
    while (!writTasks_.empty()) {
        auto &first = writTasks_.front();
        if (first.fp_) {
            off_t offset = first.offset_;
            int ret = socket_->sendfile(first.fp_->fd(), &offset, first.len_);
            if (ret <= 0) {
                if (ret != 0 && errno == EAGAIN) {
                    return;
                } else {
                    handleErroEvent();
                    return;
                }
            } else if (ret == first.len_) {
                if (first.handler_) {
                    (*first.handler_)();
                }
                writTasks_.pop_front();
                continue;
            } else {
                first.len_ -= ret;
                first.offset_ += ret;
                return;
            }
        } else {
            std::vector<struct iovec> iov;
            for (auto &x : writTasks_) {
                if (!x.fp_ && x.buffer_) {
                    struct iovec v;
                    v.iov_base = x.buffer_->data();
                    v.iov_len = x.buffer_->size();
                    iov.push_back(v);
                } else {
                    break;
                }
            }
            auto ret = socket_->writev(&iov[0], iov.size());
            if (ret > 0) {
                while (ret > 0) {
                    auto firstBufferSize = writTasks_.front().buffer_->size();
                    if (firstBufferSize <= ret) {
                        ret -= firstBufferSize;
                        if (writTasks_.front().handler_) {
                            (*writTasks_.front().handler_)();
                            if (destroy_)
                                return;
                        }
                        writTasks_.pop_front();
                    } else {
                        writTasks_.front().buffer_->retrieve(ret);
                        return;
                    }
                }
            } else {
                if (ret != 0 && errno == EAGAIN) {
                    return;
                } else {
                    handleErroEvent();
                    return;
                }
            }
        }
    }
}